

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O1

void __thiscall
MyServerConnection::OnData(MyServerConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  MyServerConnection *pMVar5;
  bool bVar6;
  SDKResult SVar7;
  char *pcVar8;
  OutputWorker *pOVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  size_t sVar13;
  int iVar14;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  *this_00;
  shared_ptr<MyServerConnection> *connection;
  pointer psVar15;
  ostringstream *poVar16;
  uint8_t *__s;
  TonkStatus status;
  TonkStatus statusBob;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  TonkStatus statusAlice;
  uint8_t msg [1400];
  TonkStatus local_610;
  pointer local_5f0;
  pointer local_5e8;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  local_5d8;
  TonkStatus local_5c0;
  undefined1 local_5a8 [1400];
  
  if (bytes == 0) {
    return;
  }
  bVar1 = *data;
  switch(bVar1) {
  case 2:
    this->P2PRequested = true;
    tonk::SDKConnection::GetStatus((TonkStatus *)&local_5f0,&this->super_SDKConnection);
    tonk::SDKConnectionList<MyServerConnection>::GetList(&local_5d8,&this->Server->ConnectionList);
    if (local_5d8.
        super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_5d8.
        super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar15 = local_5d8.
                super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        poVar16 = (ostringstream *)(local_5a8 + 0x10);
        pMVar5 = (psVar15->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        iVar14 = 0;
        if ((pMVar5 != this) && (iVar14 = 0, pMVar5->P2PRequested == true)) {
          tonk::SDKConnection::GetStatus
                    (&local_5c0,
                     &((psVar15->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_ptr)->super_SDKConnection);
          if ((int)Logger.ChannelMinLevel < 3) {
            local_5a8._0_8_ = Logger.ChannelName;
            local_5a8._8_4_ = Info;
            std::__cxx11::ostringstream::ostringstream(poVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,
                       Logger.Prefix._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar16,"Connecting Alice(",0x11);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,") and Bob(",10);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,")",1);
            pOVar9 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
            std::__cxx11::ostringstream::~ostringstream(poVar16);
            std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
          }
          SVar7 = tonk::SDKConnection::P2PConnect
                            (&this->super_SDKConnection,
                             &((psVar15->
                               super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->super_SDKConnection);
          iVar14 = 0x1c;
          if (SVar7.Result == Tonk_Success) {
            pcVar8 = tonk_result_to_string(Tonk_Success);
            std::__cxx11::string::string((string *)&local_610,pcVar8,(allocator *)local_5a8);
            if ((int)Logger.ChannelMinLevel < 5) {
              local_5a8._0_8_ = Logger.ChannelName;
              local_5a8._8_4_ = Error;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_5a8 + 0x10));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_5a8 + 0x10),Logger.Prefix._M_dataplus._M_p,
                         Logger.Prefix._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_5a8 + 0x10),"P2PConnect failed: ",0x13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_5a8 + 0x10),
                         (char *)CONCAT44(local_610.LocallyAssignedIdForRemoteHost,local_610.Flags),
                         local_610._8_8_);
              pOVar9 = logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_5a8 + 0x10));
              std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
            }
            if ((uint32_t *)CONCAT44(local_610.LocallyAssignedIdForRemoteHost,local_610.Flags) !=
                &local_610.LowPriQueueMsec) {
              operator_delete((undefined1 *)
                              CONCAT44(local_610.LocallyAssignedIdForRemoteHost,local_610.Flags));
            }
            iVar14 = 0x1d;
          }
        }
      } while (((iVar14 == 0x1d) || (iVar14 == 0)) &&
              (psVar15 = psVar15 + 1,
              psVar15 !=
              local_5d8.
              super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
              ._M_impl.super__Vector_impl_data._M_finish));
    }
    this_00 = &local_5d8;
    break;
  case 5:
    tonk::SDKConnection::GetStatus(&local_610,&this->super_SDKConnection);
    __s = data + 1;
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar16 = (ostringstream *)(local_5a8 + 0x10);
      local_5a8._0_8_ = Logger.ChannelName;
      local_5a8._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,"Rebroadcast request from ",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16," : \'",4);
      sVar13 = strlen((char *)__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,(char *)__s,sVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,"\'",1);
      pOVar9 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
      std::__cxx11::ostringstream::~ostringstream(poVar16);
      std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
    }
    local_5a8._1_4_ = local_610.LocallyAssignedIdForRemoteHost;
    local_5a8[0] = 5;
    memcpy(local_5a8 + 4,__s,(ulong)(bytes - 1));
    tonk::SDKConnectionList<MyServerConnection>::GetList
              ((vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                *)&local_5f0,&this->Server->ConnectionList);
    if (local_5f0 != local_5e8) {
      psVar15 = local_5f0;
      do {
        pMVar5 = (psVar15->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (pMVar5 != this) {
          tonk::SDKConnection::Send(&pMVar5->super_SDKConnection,local_5a8,(ulong)(bytes + 4),0x33);
        }
        psVar15 = psVar15 + 1;
      } while (psVar15 != local_5e8);
    }
    this_00 = (vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
               *)&local_5f0;
    break;
  case 6:
    if ((int)Logger.ChannelMinLevel < 2) {
      poVar16 = (ostringstream *)(local_5a8 + 0x10);
      local_5a8._0_8_ = Logger.ChannelName;
      local_5a8._8_4_ = Debug;
      std::__cxx11::ostringstream::ostringstream(poVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,"Got pre-connect data test",0x19);
      pOVar9 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
      std::__cxx11::ostringstream::~ostringstream(poVar16);
      std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
    }
    bVar6 = test::ValidatePreconnectData(channel,data,bytes);
    if (bVar6) {
      return;
    }
    if (4 < (int)Logger.ChannelMinLevel) {
      return;
    }
    poVar16 = (ostringstream *)(local_5a8 + 0x10);
    local_5a8._0_8_ = Logger.ChannelName;
    local_5a8._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream(poVar16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar16,"ERROR: Preconnect data was invalid!",0x23);
    pOVar9 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
LAB_0010444b:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_5a8 + 0x10));
    std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
    return;
  case 7:
    if ((((uint)data[6] | (uint)data[7] << 8 | (uint)data[8] << 0x10) != 0xadd12d) &&
       ((int)Logger.ChannelMinLevel < 5)) {
      poVar16 = (ostringstream *)(local_5a8 + 0x10);
      local_5a8._0_8_ = Logger.ChannelName;
      local_5a8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,"Corrupted data: Bad magic",0x19);
      pOVar9 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
      std::__cxx11::ostringstream::~ostringstream(poVar16);
      std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
    }
    uVar4 = *(uint32_t *)(data + 9);
    if ((this->NextPacketIndex != uVar4) && ((int)Logger.ChannelMinLevel < 5)) {
      poVar16 = (ostringstream *)(local_5a8 + 0x10);
      local_5a8._0_8_ = Logger.ChannelName;
      local_5a8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,"Corrupted data: Incorrect packet id",0x23);
      pOVar9 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
      std::__cxx11::ostringstream::~ostringstream(poVar16);
      std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
    }
    this->NextPacketIndex = uVar4 + 1;
    return;
  case 8:
    if ((channel != 0x98) && ((int)Logger.ChannelMinLevel < 5)) {
      poVar16 = (ostringstream *)(local_5a8 + 0x10);
      local_5a8._0_8_ = Logger.ChannelName;
      local_5a8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,"Corrupted data: Wrong channel",0x1d);
      pOVar9 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
      std::__cxx11::ostringstream::~ostringstream(poVar16);
      std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
    }
    bVar1 = data[5];
    bVar2 = data[4];
    bVar3 = data[3];
    uVar10 = tonk::SDKConnection::FromLocalTime16
                       (&this->super_SDKConnection,*(uint16_t *)(data + 1));
    uVar11 = tonk::SDKConnection::FromLocalTime23
                       (&this->super_SDKConnection,
                        (uint)bVar3 | (uint)bVar2 << 8 | (uint)bVar1 << 0x10);
    if ((((uint)data[6] | (uint)data[7] << 8 | (uint)data[8] << 0x10) != 0xadd12d) &&
       ((int)Logger.ChannelMinLevel < 5)) {
      poVar16 = (ostringstream *)(local_5a8 + 0x10);
      local_5a8._0_8_ = Logger.ChannelName;
      local_5a8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,"Corrupted data: Bad magic",0x19);
      pOVar9 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
      std::__cxx11::ostringstream::~ostringstream(poVar16);
      std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
    }
    uVar4 = *(uint32_t *)(data + 9);
    if ((this->NextPacketIndex != uVar4) && ((int)Logger.ChannelMinLevel < 5)) {
      poVar16 = (ostringstream *)(local_5a8 + 0x10);
      local_5a8._0_8_ = Logger.ChannelName;
      local_5a8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,"Corrupted data: Incorrect packet id",0x23);
      pOVar9 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
      std::__cxx11::ostringstream::~ostringstream(poVar16);
      std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
    }
    this->NextPacketIndex = uVar4 + 1;
    tonk::SDKConnection::GetStatus((TonkStatus *)local_5a8,&this->super_SDKConnection);
    if ((local_5a8._0_8_ & 1) == 0) {
      return;
    }
    uVar12 = tonk_time();
    test::OWDTimeStatistics::AddSample(&this->OWDStats,uVar12 - uVar11);
    if (uVar12 - this->LastStatsUsec < 2000000) {
      return;
    }
    this->LastStatsUsec = uVar12;
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar16 = (ostringstream *)(local_5a8 + 0x10);
      local_5a8._0_8_ = Logger.ChannelName;
      local_5a8._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar16,"DATA RESULT: Transmission time (acc=16) = ",0x2a);
      std::ostream::operator<<((ostream *)poVar16,(int)uVar12 - (int)uVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16,", (acc=23) = ",0xd);
      std::ostream::operator<<((ostream *)poVar16,(int)(uVar12 - uVar11));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar16," # ",3);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
      pOVar9 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
      std::__cxx11::ostringstream::~ostringstream(poVar16);
      std::ios_base::~ios_base((ios_base *)(local_5a8 + 0x80));
    }
    test::OWDTimeStatistics::PrintStatistics(&this->OWDStats);
    return;
  default:
    if (bVar1 == 200) {
      OnData::expected = data[1];
      return;
    }
  case 3:
  case 4:
    if (4 < (int)Logger.ChannelMinLevel) {
      return;
    }
    poVar16 = (ostringstream *)(local_5a8 + 0x10);
    local_5a8._0_8_ = Logger.ChannelName;
    local_5a8._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream(poVar16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar16,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar16,"MyServerConnection: Got ",0x18);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar16," bytes of message data unexpected type ",0x27);
    std::ostream::operator<<((ostream *)poVar16,(uint)bVar1);
    pOVar9 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_5a8);
    goto LAB_0010444b;
  }
  std::
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  ::~vector(this_00);
  return;
}

Assistant:

void MyServerConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (bytes <= 0) {
        return;
    }

    if (data[0] == 200)
    {
        static uint8_t expected = 0;
        ++expected;
        if (data[1] != expected)
        {
            //Logger.Info("UNORDERED: ", (int)data[1]);
            expected = data[1];
        }
        return;
    }

    if (data[0] == ID_LowPriBulkData_NoTimestamp)
    {
        TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
        TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
        uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
        if (magic != kLowPriBulkMagic) {
            Logger.Error("Corrupted data: Bad magic");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
        uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
        TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
        if (NextPacketIndex != packetIndex) {
            Logger.Error("Corrupted data: Incorrect packet id");
        }
        NextPacketIndex = packetIndex + 1;
        for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
            TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
        }

        return;
    }

    if (data[0] == ID_LowPriBulkData_HasTimestamp)
    {
        TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
        if (channel != kLowPriBulkData_Channel) {
            Logger.Error("Corrupted data: Wrong channel");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
        uint16_t ts16 = tonk::ReadU16_LE(data + 1);
        uint32_t ts23 = tonk::ReadU24_LE(data + 1 + 2);
        uint64_t lo16 = FromLocalTime16(ts16);
        uint64_t lo23 = FromLocalTime23(ts23);
        uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
        if (magic != kLowPriBulkMagic) {
            Logger.Error("Corrupted data: Bad magic");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
        uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
        TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
        if (NextPacketIndex != packetIndex) {
            Logger.Error("Corrupted data: Incorrect packet id");
        }
        NextPacketIndex = packetIndex + 1;
        for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i)
        {
            TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
        }

        if (0 != (GetStatus().Flags & TonkFlag_TimeSync))
        {
            uint64_t nowUsec = tonk_time();
            uint64_t owdUsec = nowUsec - lo23;
            OWDStats.AddSample(owdUsec);

            if (nowUsec - LastStatsUsec >= kStatsReportIntervalUsec)
            {
                LastStatsUsec = nowUsec;
                Logger.Info("DATA RESULT: Transmission time (acc=16) = ", (int)(nowUsec - lo16), ", (acc=23) = ", (int)(nowUsec - lo23), " # ", packetIndex);
                OWDStats.PrintStatistics();
            }
        }

        return;
    }
    if (data[0] == ID_P2PConnectionStart)
    {
        P2PRequested = true;

        TonkStatus statusBob = GetStatus();

        auto connections = Server->ConnectionList.GetList();
        for (auto& connection : connections)
        {
            // If there is a second connection that also requested P2P:
            if (connection.get() != this && connection->P2PRequested)
            {
                TonkStatus statusAlice = connection->GetStatus();

                Logger.Info("Connecting Alice(", statusAlice.LocallyAssignedIdForRemoteHost,
                    ") and Bob(", statusBob.LocallyAssignedIdForRemoteHost, ")");

                tonk::SDKResult result = this->P2PConnect(connection.get());
                if (result)
                {
                    Logger.Error("P2PConnect failed: ", result.ToString());
                    continue;
                }

                break;
            }
        }
        return;
    }
    if (data[0] == ID_ConnectionRebroadcast)
    {
        TonkStatus status = GetStatus();

        const char* str = (char*)data + 1;
        Logger.Info("Rebroadcast request from ", status.LocallyAssignedIdForRemoteHost, " : '", str, "'");

        uint8_t msg[1400];
        msg[0] = ID_ConnectionRebroadcast;
        tonk::WriteU24_LE_Min4Bytes(msg + 1, status.LocallyAssignedIdForRemoteHost);
        memcpy(msg + 1 + 3, data + 1, bytes - 1);

        auto connections = Server->ConnectionList.GetList();
        for (auto& connection : connections)
        {
            // If there is a second connection that also requested P2P:
            if (connection.get() != this) {
                connection->Send(msg, 1 + 3 + bytes, TonkChannel_Reliable0 + 1);
            }
        }
        return;
    }
    if (data[0] == ID_PreConnectDataTest)
    {
        Logger.Debug("Got pre-connect data test");

        const bool validated = ValidatePreconnectData(channel, data, bytes);

        if (!validated)
        {
            Logger.Error("ERROR: Preconnect data was invalid!");
            TONK_CPP_SDK_DEBUG_BREAK();
        }
        return;
    }

    Logger.Error("MyServerConnection: Got ", bytes, " bytes of message data unexpected type ", (int)data[0]);
    TONK_CPP_SDK_DEBUG_BREAK();
}